

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O0

bool __thiscall server::captureservmode::baseinfo::enter(baseinfo *this,char *team)

{
  int iVar1;
  char *team_local;
  baseinfo *this_local;
  
  iVar1 = strcmp(this->owner,team);
  if (iVar1 == 0) {
    this->owners = this->owners + 1;
    this_local._7_1_ = false;
  }
  else if (this->enemies == 0) {
    iVar1 = strcmp(this->enemy,team);
    if (iVar1 != 0) {
      this->converted = 0;
      copystring(this->enemy,team,0x104);
    }
    this->enemies = this->enemies + 1;
    this_local._7_1_ = true;
  }
  else {
    iVar1 = strcmp(this->enemy,team);
    if (iVar1 == 0) {
      this->enemies = this->enemies + 1;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool enter(const char *team)
        {
            if(!strcmp(owner, team))
            {
                owners++;
                return false;
            }
            if(!enemies)
            {
                if(strcmp(enemy, team))
                {
                    converted = 0;
                    copystring(enemy, team);
                }
                enemies++;
                return true;
            }
            else if(strcmp(enemy, team)) return false;
            else enemies++;
            return false;
        }